

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

void __thiscall
hbm::streaming::SubscribedSignal::setDataFormat(SubscribedSignal *this,Value *params)

{
  bool bVar1;
  undefined1 uVar2;
  UInt UVar3;
  runtime_error *prVar4;
  Value *this_00;
  long in_RDI;
  string dataTimeType;
  string dataValueType;
  string endianness;
  string dataFormatPattern;
  Value *in_stack_00000578;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Value *in_stack_fffffffffffffef8;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  Json::Value::operator[]
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  Json::Value::asString_abi_cxx11_((Value *)dataFormatPattern._0_8_);
  bVar1 = std::operator==(in_stack_fffffffffffffee0,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x58) = 0;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffee0,
                            (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x58) = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffee0,
                              (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
      ;
      if (!bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"invalid data pattern");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(undefined4 *)(in_RDI + 0x58) = 2;
    }
  }
  Json::Value::operator[]
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  Json::Value::asString_abi_cxx11_((Value *)dataFormatPattern._0_8_);
  bVar1 = std::operator==(in_stack_fffffffffffffee0,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x5c) = 1;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffee0,
                            (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (!bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"invalid endianness");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined1 *)(in_RDI + 0x5c) = 0;
  }
  Json::Value::operator[]
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  Json::Value::asString_abi_cxx11_((Value *)dataFormatPattern._0_8_);
  bVar1 = std::operator==(in_stack_fffffffffffffee0,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x60) = 2;
    *(undefined8 *)(in_RDI + 0x68) = 4;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffee0,
                            (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x60) = 0;
      *(undefined8 *)(in_RDI + 0x68) = 4;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffee0,
                              (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
      ;
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x60) = 1;
        *(undefined8 *)(in_RDI + 0x68) = 4;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffee0,
                                (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                ));
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0x60) = 5;
          *(undefined8 *)(in_RDI + 0x68) = 8;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffee0,
                                  (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                   in_stack_fffffffffffffed8));
          if (bVar1) {
            *(undefined4 *)(in_RDI + 0x60) = 3;
            *(undefined8 *)(in_RDI + 0x68) = 8;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffee0,
                                    (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8));
            if (bVar1) {
              *(undefined4 *)(in_RDI + 0x60) = 4;
              *(undefined8 *)(in_RDI + 0x68) = 8;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffee0,
                                      (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                       in_stack_fffffffffffffed8));
              if (!bVar1) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar4,"invalid value type");
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              *(undefined4 *)(in_RDI + 0x60) = 6;
              *(undefined8 *)(in_RDI + 0x68) = 1;
            }
          }
        }
      }
    }
  }
  Json::Value::operator[]
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  this_00 = Json::Value::operator[]
                      (in_stack_fffffffffffffef8,
                       (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  Json::Value::asString_abi_cxx11_((Value *)dataFormatPattern._0_8_);
  uVar2 = std::operator==(in_stack_fffffffffffffee0,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if ((bool)uVar2) {
    *(undefined4 *)(in_RDI + 0x70) = 0;
  }
  Json::Value::operator[](this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
  Json::Value::operator[](this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
  UVar3 = Json::Value::asUInt(in_stack_00000578);
  *(ulong *)(in_RDI + 0x78) = (ulong)UVar3;
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SubscribedSignal::setDataFormat(const Json::Value& params)
		{
			std::string dataFormatPattern = params["pattern"].asString();
			if(dataFormatPattern=="V") {
				m_dataFormatPattern = PATTERN_V;
			} else if(dataFormatPattern=="TV"){
				m_dataFormatPattern = PATTERN_TV;
			} else if(dataFormatPattern=="TB"){
				m_dataFormatPattern = PATTERN_TB;
			} else {
				throw std::runtime_error("invalid data pattern");
			}

			std::string endianness = params["endian"].asString();
			if(endianness=="big") {
				m_dataIsBigEndian = true;
			} else if(endianness=="little") {
				m_dataIsBigEndian = false;
			} else {
				throw std::runtime_error("invalid endianness");
			}
			std::string dataValueType = params["valueType"].asString();
			if(dataValueType=="real32") {
				m_dataValueType = DATATYPE_REAL32;
				m_dataValueSize = 4;
			} else if(dataValueType=="u32") {
				m_dataValueType = DATATYPE_U32;
				m_dataValueSize = 4;
			} else if(dataValueType=="s32") {
				m_dataValueType = DATATYPE_S32;
				m_dataValueSize = 4;
			} else if(dataValueType=="real64") {
				m_dataValueType = DATATYPE_REAL64;
				m_dataValueSize = 8;
			} else if(dataValueType=="u64") {
				m_dataValueType = DATATYPE_U64;
				m_dataValueSize = 8;
			} else if(dataValueType=="s64") {
				m_dataValueType = DATATYPE_S64;
				m_dataValueSize = 8;
            } else if(dataValueType == "CanRaw") {
                m_dataValueType = DATATYPE_CANRAW;
                m_dataValueSize = 1;
			} else {
				throw std::runtime_error("invalid value type");
			}


			std::string dataTimeType = params["time"]["type"].asString();
			if(dataTimeType=="ntp") {
				m_dataTimeType = TIMETYPE_NTP;
			}

			m_dataTimeSize = params["time"]["size"].asUInt();

		}